

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void initialize_impute_calc<ImputedData<int,double>,InputData<float,int>>
               (ImputedData<int,_double> *imp,InputData<float,_int> *input_data,size_t row)

{
  size_type sVar1;
  uint uVar2;
  reference pvVar3;
  int *piVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *this;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t cat;
  size_t col_2;
  size_t col_1;
  int *res;
  size_t col;
  size_type in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  unsigned_long *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  value_type in_stack_ffffffffffffff84;
  ulong local_68;
  int *local_58;
  ulong local_40;
  ulong local_20;
  
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  if (*in_RSI == 0) {
    if (in_RSI[0xd] != 0) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (size_type)in_stack_ffffffffffffff78);
      for (local_40 = 0; local_40 < (ulong)in_RSI[1]; local_40 = local_40 + 1) {
        piVar4 = std::lower_bound<int*,unsigned_long>
                           ((int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        if (((piVar4 != (int *)(in_RSI[0xc] + (long)*(int *)(in_RSI[0xd] + 4 + local_40 * 4) * 4))
            && (*piVar4 == (int)in_RDX)) &&
           ((uVar2 = std::isnan((double)(ulong)*(uint *)(in_RSI[0xb] +
                                                        ((long)piVar4 - in_RSI[0xc] >> 2) * 4)),
            (uVar2 & 1) != 0 ||
            (uVar2 = std::isinf((double)(ulong)*(uint *)(in_RSI[0xb] +
                                                        ((long)piVar4 - in_RSI[0xc] >> 2) * 4)),
            (uVar2 & 1) != 0)))) {
          in_stack_ffffffffffffff84 = (value_type)local_40;
          sVar1 = *(size_type *)(in_RDI + 0xe8);
          *(size_type *)(in_RDI + 0xe8) = sVar1 + 1;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),sVar1);
          *pvVar5 = in_stack_ffffffffffffff84;
        }
      }
      std::vector<double,_std::allocator<double>_>::assign
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(value_type_conflict *)0x455798
                );
      std::vector<double,_std::allocator<double>_>::assign
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(value_type_conflict *)0x4557c6
                );
    }
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (size_type)in_stack_ffffffffffffff78);
    for (local_20 = 0; local_20 < (ulong)in_RSI[1]; local_20 = local_20 + 1) {
      uVar2 = std::isnan((double)(ulong)*(uint *)(*in_RSI + (in_RDX + local_20 * in_RSI[6]) * 4));
      if (((uVar2 & 1) != 0) ||
         (uVar2 = std::isinf((double)(ulong)*(uint *)(*in_RSI + (in_RDX + local_20 * in_RSI[6]) * 4)
                            ), (uVar2 & 1) != 0)) {
        sVar1 = *(size_type *)(in_RDI + 0xd8);
        *(size_type *)(in_RDI + 0xd8) = sVar1 + 1;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x90)
                            ,sVar1);
        *pvVar3 = local_20;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (size_type)in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(value_type_conflict *)0x455578);
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(value_type_conflict *)0x4555a6);
  }
  if (in_RSI[2] != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (size_type)in_stack_ffffffffffffff78);
    for (local_58 = (int *)0x0; local_58 < (int *)in_RSI[5]; local_58 = (int *)((long)local_58 + 1))
    {
      if (*(int *)(in_RSI[2] + (in_RDX + (long)local_58 * in_RSI[6]) * 4) < 0) {
        sVar1 = *(size_type *)(in_RDI + 0xe0);
        *(size_type *)(in_RDI + 0xe0) = sVar1 + 1;
        in_stack_ffffffffffffff78 = local_58;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xa8)
                            ,sVar1);
        *pvVar3 = (value_type)in_stack_ffffffffffffff78;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (size_type)in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(value_type_conflict *)0x4558f3);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (size_type)in_stack_ffffffffffffff78);
    for (local_68 = 0; local_68 < *(ulong *)(in_RDI + 0xe0); local_68 = local_68 + 1) {
      this = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x30);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xa8),
                          local_68);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)this,*pvVar3);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xa8),local_68);
      std::vector<double,_std::allocator<double>_>::assign
                (this,in_stack_ffffffffffffff58,(value_type_conflict *)0x4559c0);
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, InputData &input_data, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (input_data.numeric_data != NULL)
    {
        imp.missing_num.resize(input_data.ncols_numeric);
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                imp.missing_num[imp.n_missing_num++] = col;
        imp.missing_num.resize(imp.n_missing_num);
        imp.num_sum.assign(imp.n_missing_num,    0);
        imp.num_weight.assign(imp.n_missing_num, 0);
    }

    else if (input_data.Xc_indptr != NULL)
    {
        imp.missing_sp.resize(input_data.ncols_numeric);
        decltype(input_data.Xc_indptr) res;
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            res = std::lower_bound(input_data.Xc_ind + input_data.Xc_indptr[col],
                                   input_data.Xc_ind + input_data.Xc_indptr[col + 1],
                                   row);
            if (
                res != input_data.Xc_ind + input_data.Xc_indptr[col + 1] && 
                *res == static_cast<typename std::remove_pointer<decltype(res)>::type>(row) && 
                is_na_or_inf(input_data.Xc[res - input_data.Xc_ind])
                )
            {
                imp.missing_sp[imp.n_missing_sp++] = col;
            }
        }
        imp.sp_num_sum.assign(imp.n_missing_sp,    0);
        imp.sp_num_weight.assign(imp.n_missing_sp, 0);
    }
    
    if (input_data.categ_data != NULL)
    {
        imp.missing_cat.resize(input_data.ncols_categ);
        for (size_t col = 0; col < input_data.ncols_categ; col++)
            if (input_data.categ_data[row + col * input_data.nrows] < 0)
                imp.missing_cat[imp.n_missing_cat++] = col;
        imp.missing_cat.resize(imp.n_missing_cat);
        imp.cat_weight.assign(imp.n_missing_cat, 0);
        imp.cat_sum.resize(input_data.ncols_categ);
        for (size_t cat = 0; cat < imp.n_missing_cat; cat++)
            imp.cat_sum[imp.missing_cat[cat]].assign(input_data.ncat[imp.missing_cat[cat]], 0);
    }
}